

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# go.h
# Opt level: O0

bool __thiscall GoState<3U,_4U>::is_move_possible(GoState<3U,_4U> *this,int i,int j,int player)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  int in_ECX;
  uint in_EDX;
  uint in_ESI;
  long *in_RDI;
  bool possible;
  set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  pieces;
  int opponent;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  *in_stack_ffffffffffffff38;
  _Self local_80;
  undefined4 local_74;
  _Self local_70 [3];
  byte local_51;
  undefined1 local_50 [48];
  uint local_20;
  int local_1c;
  uint local_18;
  uint local_14;
  byte local_1;
  
  local_20 = 3 - in_ECX;
  if (((((int)in_ESI < 0) || (2 < in_ESI)) || ((int)in_EDX < 0)) || (3 < in_EDX)) {
    local_1 = 0;
  }
  else if (*(char *)((long)in_RDI + (long)(int)in_EDX + (long)(int)in_ESI * 4 + 8) == '\0') {
    local_1c = in_ECX;
    local_18 = in_EDX;
    local_14 = in_ESI;
    std::
    set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
    ::set((set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
           *)0x1abd03);
    *(undefined1 *)((long)in_RDI + (long)(int)local_18 + 8 + (long)(int)local_14 * 4) =
         (undefined1)local_1c;
    local_51 = 0;
    bVar1 = (**(code **)(*in_RDI + 0x48))(in_RDI,local_14,local_18,local_50);
    if ((bVar1 & 1) == 0) {
      if ((((int)local_14 < 1) ||
          (*(byte *)((long)in_RDI + (long)(int)local_18 + (long)(int)(local_14 - 1) * 4 + 8) !=
           local_20)) ||
         (bVar1 = (**(code **)(*in_RDI + 0x48))(in_RDI,local_14 - 1,local_18,local_50),
         (bVar1 & 1) != 0)) {
        if (((local_14 < 2) &&
            (*(byte *)((long)in_RDI + (long)(int)local_18 + (long)(int)(local_14 + 1) * 4 + 8) ==
             local_20)) &&
           (bVar1 = (**(code **)(*in_RDI + 0x48))(in_RDI,local_14 + 1,local_18,local_50),
           (bVar1 & 1) == 0)) {
          local_51 = 1;
        }
        else if ((((int)local_18 < 1) ||
                 (*(byte *)((long)in_RDI + (long)(int)(local_18 - 1) + (long)(int)local_14 * 4 + 8)
                  != local_20)) ||
                (bVar1 = (**(code **)(*in_RDI + 0x48))(in_RDI,local_14,local_18 - 1,local_50),
                (bVar1 & 1) != 0)) {
          if (((local_18 < 3) &&
              (*(byte *)((long)in_RDI + (long)(int)(local_18 + 1) + (long)(int)local_14 * 4 + 8) ==
               local_20)) &&
             (bVar1 = (**(code **)(*in_RDI + 0x48))(in_RDI,local_14,local_18 + 1,local_50),
             (bVar1 & 1) == 0)) {
            local_51 = 1;
          }
        }
        else {
          local_51 = 1;
        }
      }
      else {
        local_51 = 1;
      }
    }
    else {
      local_51 = 1;
    }
    if ((local_51 & 1) != 0) {
      iVar3 = (**(code **)(*in_RDI + 0x20))();
      if (iVar3 == *(int *)((long)in_RDI + 0x14)) {
        local_51 = 0;
      }
      else {
        local_74 = (**(code **)(*in_RDI + 0x20))();
        local_70[0]._M_node =
             (_Base_ptr)
             std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::find
                       (in_stack_ffffffffffffff38,(key_type_conflict *)0x1abfd0);
        local_80._M_node =
             (_Base_ptr)
             std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::end
                       (in_stack_ffffffffffffff38);
        bVar2 = std::operator!=(local_70,&local_80);
        if (bVar2) {
          local_51 = 0;
        }
      }
    }
    if (((local_51 & 1) != 0) &&
       (bVar1 = (**(code **)(*in_RDI + 0x38))(in_RDI,local_14,local_18,local_1c), (bVar1 & 1) != 0))
    {
      local_51 = 0;
    }
    *(undefined1 *)((long)in_RDI + (long)(int)local_18 + (long)(int)local_14 * 4 + 8) = 0;
    local_1 = local_51 & 1;
    std::
    set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
    ::~set((set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
            *)0x1ac08e);
  }
  else {
    local_1 = 0;
  }
  return (bool)(local_1 & 1);
}

Assistant:

virtual bool is_move_possible(const int i, const int j, const int player) const
	{
		const int opponent = 3 - player;

		if (0 <= i && i < M && 0 <= j && j < N) {
			if (board[i][j] != empty) {
				return false;
			}

			// See if it is possible to move into this empty place.
			std::set<std::pair<int, int>> pieces;
			board[i][j] = player;

			bool possible = false;
			if (is_alive(i, j, &pieces)) {
				// This stone is immediately alive.
				possible = true;
			}
			else {
				// This stone may have killed opponents so
				// that it is alive.

				if (i > 0 && board[i - 1][j] == opponent && !is_alive(i - 1, j, &pieces)) {
					possible = true;
				}
				else if (i < M - 1 && board[i + 1][j] == opponent && !is_alive(i + 1, j, &pieces)) {
					possible = true;
				}
				else if (j > 0 && board[i][j - 1] == opponent && !is_alive(i, j - 1, &pieces)) {
					possible = true;
				}
				else if (j < N - 1 && board[i][j + 1] == opponent && !is_alive(i, j + 1, &pieces)) {
					possible = true;
				}
			}

			if (possible) {
				// Ko rule tests.
				if (compute_hash_value() == previous_board_hash_value) {			
					possible = false;
				}
				else if (all_hash_values.find(compute_hash_value()) != all_hash_values.end()) {
					possible = false;
				}
			}

			if (possible) {
				// Not possible to play in one's own eye.
				if (is_eye(i, j, player)) {
					possible = false;
				}
			}

			board[i][j] = empty;
			return possible;
		}
		else {
			// Not a valid position.
			return false;
		}
	}